

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseCharDataComplex(xmlParserCtxtPtr ctxt,int partial)

{
  byte bVar1;
  byte *pbVar2;
  uint val;
  int iVar3;
  long lVar4;
  xmlParserInputPtr pxVar5;
  xmlChar *pxVar6;
  uint size;
  int l;
  xmlChar buf [305];
  int local_16c;
  xmlChar local_168 [312];
  
  val = xmlCurrentChar(ctxt,&local_16c);
  if (val == 0x200000) {
    val = 0xfffd;
  }
  size = 0;
LAB_001426b9:
  if ((val == 0x26) || (val == 0x3c)) {
LAB_00142823:
    if (size != 0) {
      local_168[(int)size] = '\0';
      xmlCharacters(ctxt,local_168,size);
    }
    pbVar2 = ctxt->input->cur;
    if ((pbVar2 < ctxt->input->end) &&
       ((0x37 < val - 0x26 || ((0x80000000400001U >> ((ulong)(val - 0x26) & 0x3f) & 1) == 0)))) {
      if ((val == 0) && (bVar1 = *pbVar2, bVar1 != 0)) {
        if (partial != 0) {
          return;
        }
        xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_INVALID_CHAR,XML_ERR_FATAL,
                   (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,(uint)bVar1,
                   "Incomplete UTF-8 sequence starting with %02X\n",(uint)bVar1);
        pxVar5 = ctxt->input;
        if (*pxVar5->cur == '\n') {
          pxVar5->line = pxVar5->line + 1;
          pxVar5->col = 1;
        }
        else {
          pxVar5->col = pxVar5->col + 1;
        }
        pxVar6 = pxVar5->cur + 1;
      }
      else {
        xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_INVALID_CHAR,XML_ERR_FATAL,
                   (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,val,"PCDATA invalid Char value %d\n"
                   ,val);
        pxVar5 = ctxt->input;
        if (*pxVar5->cur == '\n') {
          pxVar5->line = pxVar5->line + 1;
          pxVar5->col = 1;
        }
        else {
          pxVar5->col = pxVar5->col + 1;
        }
        pxVar6 = pxVar5->cur + local_16c;
      }
      pxVar5->cur = pxVar6;
    }
    return;
  }
  if ((partial == 0) || (val != 0x5d)) {
    if (0xff < (int)val) {
      if (0xfffff < val - 0x10000 && (0x1ffd < val - 0xe000 && 0xd7ff < val)) goto LAB_00142823;
LAB_00142774:
      iVar3 = xmlCopyCharMultiByte(local_168 + (int)size,val);
      size = size + iVar3;
      goto LAB_0014278a;
    }
    if ((val < 0xe) && ((0x2600U >> (val & 0x1f) & 1) != 0)) goto LAB_00142734;
    if ((int)val < 0x20) goto LAB_00142823;
    if (val == 0x5d) goto LAB_001426ed;
    if (0x7f < val) goto LAB_00142774;
  }
  else {
    if ((long)ctxt->input->end - (long)ctxt->input->cur < 2) goto LAB_00142823;
LAB_001426ed:
    pxVar6 = ctxt->input->cur;
    if ((pxVar6[1] == ']') && (pxVar6[2] == '>')) {
      xmlFatalErr(ctxt,XML_ERR_MISPLACED_CDATA_END,(char *)0x0);
    }
  }
LAB_00142734:
  lVar4 = (long)(int)size;
  size = size + 1;
  local_168[lVar4] = (xmlChar)val;
LAB_0014278a:
  pxVar5 = ctxt->input;
  if (*pxVar5->cur == '\n') {
    pxVar5->line = pxVar5->line + 1;
    pxVar5->col = 1;
  }
  else {
    pxVar5->col = pxVar5->col + 1;
  }
  pxVar5->cur = pxVar5->cur + local_16c;
  if (299 < (int)size) {
    local_168[size] = '\0';
    xmlCharacters(ctxt,local_168,size);
    size = 0;
    if ((ctxt->input->flags & 0x40) == 0) {
      xmlParserShrink(ctxt);
    }
  }
  val = xmlCurrentChar(ctxt,&local_16c);
  if (val == 0x200000) {
    val = 0xfffd;
  }
  goto LAB_001426b9;
}

Assistant:

static void
xmlParseCharDataComplex(xmlParserCtxtPtr ctxt, int partial) {
    xmlChar buf[XML_PARSER_BIG_BUFFER_SIZE + 5];
    int nbchar = 0;
    int cur, l;

    cur = xmlCurrentCharRecover(ctxt, &l);
    while ((cur != '<') && /* checked */
           (cur != '&') &&
           ((!partial) || (cur != ']') ||
            (ctxt->input->end - ctxt->input->cur >= 2)) &&
	   (IS_CHAR(cur))) {
	if ((cur == ']') && (NXT(1) == ']') && (NXT(2) == '>')) {
	    xmlFatalErr(ctxt, XML_ERR_MISPLACED_CDATA_END, NULL);
	}
	COPY_BUF(buf, nbchar, cur);
	/* move current position before possible calling of ctxt->sax->characters */
	NEXTL(l);
	if (nbchar >= XML_PARSER_BIG_BUFFER_SIZE) {
	    buf[nbchar] = 0;

            xmlCharacters(ctxt, buf, nbchar);
	    nbchar = 0;
            SHRINK;
	}
	cur = xmlCurrentCharRecover(ctxt, &l);
    }
    if (nbchar != 0) {
        buf[nbchar] = 0;

        xmlCharacters(ctxt, buf, nbchar);
    }
    /*
     * cur == 0 can mean
     *
     * - End of buffer.
     * - An actual 0 character.
     * - An incomplete UTF-8 sequence. This is allowed if partial is set.
     */
    if (ctxt->input->cur < ctxt->input->end) {
        if ((cur == 0) && (CUR != 0)) {
            if (partial == 0) {
                xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                        "Incomplete UTF-8 sequence starting with %02X\n", CUR);
                NEXTL(1);
            }
        } else if ((cur != '<') && (cur != '&') && (cur != ']')) {
            /* Generate the error and skip the offending character */
            xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                              "PCDATA invalid Char value %d\n", cur);
            NEXTL(l);
        }
    }
}